

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

string * __thiscall
leveldb::InternalKey::DebugString_abi_cxx11_(string *__return_storage_ptr__,InternalKey *this)

{
  ulong uVar1;
  Slice *value;
  ParsedInternalKey parsed;
  string local_68;
  ParsedInternalKey local_48;
  pointer local_28;
  size_type local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48.user_key.data_ = "";
  local_48.user_key.size_ = 0;
  uVar1 = (this->rep_)._M_string_length;
  if (7 < uVar1) {
    local_48.user_key.data_ = (this->rep_)._M_dataplus._M_p;
    local_48.type = (ValueType)*(ulong *)(local_48.user_key.data_ + (uVar1 - 8)) & 0xff;
    local_48.sequence = *(ulong *)(local_48.user_key.data_ + (uVar1 - 8)) >> 8;
    local_48.user_key.size_ = uVar1 - 8;
    if (local_48.type < 2) {
      ParsedInternalKey::DebugString_abi_cxx11_(&local_68,&local_48);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      goto LAB_0010e693;
    }
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x123186);
  local_28 = (this->rep_)._M_dataplus._M_p;
  local_20 = (this->rep_)._M_string_length;
  EscapeString_abi_cxx11_(&local_68,(leveldb *)&local_28,value);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
LAB_0010e693:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InternalKey::DebugString() const {
        std::string result;
        ParsedInternalKey parsed;
        if (ParseInternalKey(rep_, &parsed)) {
            result = parsed.DebugString();
        } else {
            result = "(bad)";
            result.append(EscapeString(rep_));
        }
        return result;
    }